

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_helper.h
# Opt level: O0

void serialization::
     serialize_container_helper<serialization::xml_oarchive,std::vector<int,std::allocator<int>>>
               (xml_oarchive *ar,vector<int,_std::allocator<int>_> *v)

{
  vector<int,_std::allocator<int>_> *this;
  bool bVar1;
  size_type sVar2;
  reference obj;
  int *i;
  const_iterator __end0;
  const_iterator __begin0;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> *pvStack_18;
  serialization_trace trace;
  vector<int,_std::allocator<int>_> *v_local;
  xml_oarchive *ar_local;
  
  __range2._0_4_ = 0x45;
  pvStack_18 = v;
  serialization_trace::serialization_trace<char_const(&)[27],char_const(&)[140],int>
            ((serialization_trace *)((long)&__range2 + 7),
             (char (*) [27])"serialize_container_helper",
             (char (*) [140])
             "/workspace/llm4binary/github/license_c_cmakelists/avplayer[P]serialization2/examples/../include/serialization/detail/serialization_helper.h"
             ,(int *)&__range2);
  sVar2 = std::vector<int,_std::allocator<int>_>::size(pvStack_18);
  xml_oarchive::save_sequence_start(ar,(size_type)sVar2);
  this = pvStack_18;
  __end0 = std::vector<int,_std::allocator<int>_>::begin(pvStack_18);
  i = (int *)std::vector<int,_std::allocator<int>_>::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                *)&i);
    if (!bVar1) break;
    obj = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator*(&__end0);
    xml_oarchive::save_sequence_item_start(ar);
    serialize_helper<serialization::xml_oarchive,int>(ar,obj);
    xml_oarchive::save_sequence_item_end(ar);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end0);
  }
  xml_oarchive::save_sequence_end(ar);
  return;
}

Assistant:

inline void serialize_container_helper(Archive & ar, const T & v)
{
    serialization_trace trace(__func__, __FILE__, __LINE__);

    ar.save_sequence_start(v.size());
    for(const auto & i : v)
    {
        ar.save_sequence_item_start();
        serialize_helper(ar, i);
        ar.save_sequence_item_end();
    }
    ar.save_sequence_end();
}